

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderManager.cpp
# Opt level: O2

Mesh * __thiscall
Rml::RenderManager::ReleaseResource
          (Mesh *__return_storage_ptr__,RenderManager *this,Geometry *geometry)

{
  code *pcVar1;
  bool bVar2;
  GeometryData *__obj;
  StableVectorIndex index;
  GeometryData local_90;
  Mesh local_58;
  
  index = (geometry->
          super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
          ).resource_handle;
  if (index == Invalid ||
      (geometry->
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ).render_manager != this) {
    bVar2 = Assert("RMLUI_ASSERT(geometry.render_manager == this && geometry.resource_handle != geometry.InvalidHandle())"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/RenderManager.cpp"
                   ,0x16c);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    index = (geometry->
            super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
            ).resource_handle;
  }
  __obj = StableVector<Rml::RenderManager::GeometryData>::operator[](&this->geometry_list,index);
  if (__obj->handle != 0) {
    (*this->render_interface->_vptr_RenderInterface[4])();
    __obj->handle = 0;
  }
  local_58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.vertices.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::__exchange<Rml::Mesh,Rml::Mesh>(__return_storage_ptr__,&__obj->mesh,&local_58);
  Mesh::~Mesh(&local_58);
  StableVector<Rml::RenderManager::GeometryData>::erase
            (&local_90,&this->geometry_list,
             (geometry->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             ).resource_handle);
  Mesh::~Mesh(&local_90.mesh);
  return __return_storage_ptr__;
}

Assistant:

Mesh RenderManager::ReleaseResource(const Geometry& geometry)
{
	RMLUI_ASSERT(geometry.render_manager == this && geometry.resource_handle != geometry.InvalidHandle());

	GeometryData& data = geometry_list[geometry.resource_handle];
	if (data.handle)
	{
		render_interface->ReleaseGeometry(data.handle);
		data.handle = {};
	}
	Mesh result = std::exchange(data.mesh, Mesh());
	geometry_list.erase(geometry.resource_handle);
	return result;
}